

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

int fy_scan_yaml_version(fy_parser *fyp,fy_atom *handle)

{
  _Bool _Var1;
  int iVar2;
  int length;
  int c;
  fy_atom *handle_local;
  fy_parser *fyp_local;
  
  memset(handle,0,0x38);
  while( true ) {
    iVar2 = fy_parse_peek(fyp);
    _Var1 = fy_is_ws(iVar2);
    if (!_Var1) break;
    fy_advance(fyp,iVar2);
  }
  iVar2 = fy_scan_yaml_version_length(fyp);
  if (iVar2 < 1) {
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x594,"fy_scan_yaml_version","fy_scan_yaml_version_length() failed");
    fyp_local._4_4_ = -1;
  }
  else {
    fy_fill_atom(fyp,iVar2,handle);
    fyp_local._4_4_ = 0;
  }
  return fyp_local._4_4_;
}

Assistant:

int fy_scan_yaml_version(struct fy_parser *fyp, struct fy_atom *handle) {
    int c, length;

    memset(handle, 0, sizeof(*handle));

    /* skip white space */
    while (fy_is_ws(c = fy_parse_peek(fyp)))
        fy_advance(fyp, c);

    length = fy_scan_yaml_version_length(fyp);
    fyp_error_check(fyp, length > 0, err_out,
                    "fy_scan_yaml_version_length() failed");

    fy_fill_atom(fyp, length, handle);

    return 0;

    err_out:
    return -1;
}